

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.c
# Opt level: O1

int owner_parse(char *spec,cpio_owner *owner,char **errmsg)

{
  char cVar1;
  byte bVar2;
  char *pcVar3;
  passwd *ppVar4;
  char *pcVar5;
  group *pgVar6;
  int *piVar7;
  ulong uVar8;
  size_t __n;
  byte *pbVar9;
  byte *__name;
  int iVar10;
  char *end;
  char *local_40;
  byte *local_38;
  
  owner->uid = -1;
  owner->gid = -1;
  owner->uname = (char *)0x0;
  owner->gname = (char *)0x0;
  cVar1 = *spec;
  if (cVar1 == '\0') {
    pcVar3 = "Invalid empty user/group spec";
    goto LAB_00102a69;
  }
  if ((cVar1 == '.') || (pbVar9 = (byte *)spec, cVar1 == ':')) {
    __name = (byte *)(spec + 1);
    pbVar9 = (byte *)0x0;
    spec = (char *)0x0;
  }
  else {
    while( true ) {
      bVar2 = *pbVar9;
      if (((ulong)bVar2 < 0x3b) && ((0x400400000000001U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) break;
      pbVar9 = pbVar9 + 1;
    }
    __name = pbVar9 + (bVar2 != 0);
  }
  if (spec == (char *)0x0) {
LAB_001029a1:
    if (*__name == 0) {
      return 0;
    }
    pgVar6 = getgrnam((char *)__name);
    if (pgVar6 == (group *)0x0) {
      piVar7 = __errno_location();
      *piVar7 = 0;
      uVar8 = strtoul((char *)__name,&local_40,10);
      owner->gid = (int)uVar8;
      if ((*piVar7 == 0) && (*local_40 == '\0')) {
        iVar10 = 0;
      }
      else {
        snprintf(owner_parse::errbuff,0x80,"Couldn\'t lookup group ``%s\'\'",__name);
        owner_parse::errbuff[0x7f] = '\0';
        *errmsg = owner_parse::errbuff;
        iVar10 = 1;
      }
    }
    else {
      owner->gid = pgVar6->gr_gid;
      pcVar3 = strdup(pgVar6->gr_name);
      owner->gname = pcVar3;
      iVar10 = 0;
      if (pcVar3 == (char *)0x0) {
        free(owner->uname);
        owner->uname = (char *)0x0;
        iVar10 = 4;
      }
    }
    if (iVar10 != 4) {
      if (iVar10 == 0) {
        return 0;
      }
      return -1;
    }
  }
  else {
    __n = (long)pbVar9 - (long)spec;
    local_38 = __name;
    pcVar3 = (char *)malloc(__n + 1);
    iVar10 = 4;
    if (pcVar3 != (char *)0x0) {
      memcpy(pcVar3,spec,__n);
      pcVar3[__n] = '\0';
      ppVar4 = getpwnam(pcVar3);
      if (ppVar4 == (passwd *)0x0) {
        piVar7 = __errno_location();
        *piVar7 = 0;
        uVar8 = strtoul(pcVar3,&local_40,10);
        owner->uid = (int)uVar8;
        if ((*piVar7 == 0) && (*local_40 == '\0')) goto LAB_001028f4;
        snprintf(owner_parse::errbuff,0x80,"Couldn\'t lookup user ``%s\'\'");
        owner_parse::errbuff[0x7f] = '\0';
        free(pcVar3);
        *errmsg = owner_parse::errbuff;
        iVar10 = 1;
      }
      else {
        owner->uid = ppVar4->pw_uid;
        pcVar5 = strdup(ppVar4->pw_name);
        owner->uname = pcVar5;
        if (pcVar5 == (char *)0x0) {
          free(pcVar3);
        }
        else {
          if (*pbVar9 != 0) {
            owner->gid = ppVar4->pw_gid;
          }
LAB_001028f4:
          free(pcVar3);
          iVar10 = 0;
        }
      }
    }
    if (iVar10 != 4) {
      __name = local_38;
      if (iVar10 != 0) {
        return -1;
      }
      goto LAB_001029a1;
    }
  }
  pcVar3 = "Couldn\'t allocate memory";
LAB_00102a69:
  *errmsg = pcVar3;
  return -1;
}

Assistant:

int
owner_parse(const char *spec, struct cpio_owner *owner, const char **errmsg)
{
	static char errbuff[128];
	const char *u, *ue, *g;

	owner->uid = -1;
	owner->gid = -1;

	owner->uname = NULL;
	owner->gname = NULL;

	if (spec[0] == '\0') {
		*errmsg = "Invalid empty user/group spec";
		return (-1);
	}

	/*
	 * Split spec into [user][:.][group]
	 *  u -> first char of username, NULL if no username
	 *  ue -> first char after username (colon, period, or \0)
	 *  g -> first char of group name
	 */
	if (*spec == ':' || *spec == '.') {
		/* If spec starts with ':' or '.', then just group. */
		ue = u = NULL;
		g = spec + 1;
	} else {
		/* Otherwise, [user] or [user][:] or [user][:][group] */
		ue = u = spec;
		while (*ue != ':' && *ue != '.' && *ue != '\0')
			++ue;
		g = ue;
		if (*g != '\0') /* Skip : or . to find first char of group. */
			++g;
	}

	if (u != NULL) {
		/* Look up user: ue is first char after end of user. */
		char *user;
		struct passwd *pwent;

		user = malloc(ue - u + 1);
		if (user == NULL)
			goto alloc_error;
		memcpy(user, u, ue - u);
		user[ue - u] = '\0';
		if ((pwent = getpwnam(user)) != NULL) {
			owner->uid = pwent->pw_uid;
			owner->uname = strdup(pwent->pw_name);
			if (owner->uname == NULL) {
				free(user);
				goto alloc_error;
			}
			if (*ue != '\0')
				owner->gid = pwent->pw_gid;
		} else {
			char *end;
			errno = 0;
			owner->uid = (int)strtoul(user, &end, 10);
			if (errno || *end != '\0') {
				snprintf(errbuff, sizeof(errbuff),
				    "Couldn't lookup user ``%s''", user);
				errbuff[sizeof(errbuff) - 1] = '\0';
				free(user);
				*errmsg = errbuff;
				return (-1);
			}
		}
		free(user);
	}

	if (*g != '\0') {
		struct group *grp;
		if ((grp = getgrnam(g)) != NULL) {
			owner->gid = grp->gr_gid;
			owner->gname = strdup(grp->gr_name);
			if (owner->gname == NULL) {
				free(owner->uname);
				owner->uname = NULL;
				goto alloc_error;
			}
		} else {
			char *end;
			errno = 0;
			owner->gid = (int)strtoul(g, &end, 10);
			if (errno || *end != '\0') {
				snprintf(errbuff, sizeof(errbuff),
				    "Couldn't lookup group ``%s''", g);
				errbuff[sizeof(errbuff) - 1] = '\0';
				*errmsg = errbuff;
				return (-1);
			}
		}
	}
	return (0);
alloc_error:
	*errmsg = "Couldn't allocate memory";
	return (-1);
}